

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt_env_infrastructure.cpp
# Opt level: O2

void __thiscall
so_5::env_infrastructures::default_mt::impl::mt_env_infrastructure_t::
run_default_dispatcher_and_go_further(mt_env_infrastructure_t *this,env_init_t *init_fn)

{
  dispatcher_t *pdVar1;
  mt_env_infrastructure_t *this_00;
  allocator local_152;
  allocator local_151;
  anon_class_8_1_8991fb9c local_150 [9];
  function<void_()> local_108;
  string local_e8 [128];
  string local_68 [32];
  mt_env_infrastructure_t *local_48;
  function<void_()> local_40;
  
  std::__cxx11::string::string(local_e8,"run_default_dispatcher",&local_152);
  local_150[0].this = this;
  local_48 = this;
  std::function<void_()>::function(&local_40,init_fn);
  pdVar1 = (this->m_default_dispatcher)._M_t.
           super___uniq_ptr_impl<so_5::dispatcher_t,_std::default_delete<so_5::dispatcher_t>_>._M_t.
           super__Tuple_impl<0UL,_so_5::dispatcher_t_*,_std::default_delete<so_5::dispatcher_t>_>.
           super__Head_base<0UL,_so_5::dispatcher_t_*,_false>._M_head_impl;
  std::__cxx11::string::string(local_68,"DEFAULT",&local_151);
  (*pdVar1->_vptr_dispatcher_t[5])(pdVar1,local_68);
  std::__cxx11::string::~string(local_68);
  pdVar1 = (this->m_default_dispatcher)._M_t.
           super___uniq_ptr_impl<so_5::dispatcher_t,_std::default_delete<so_5::dispatcher_t>_>._M_t.
           super__Tuple_impl<0UL,_so_5::dispatcher_t_*,_std::default_delete<so_5::dispatcher_t>_>.
           super__Head_base<0UL,_so_5::dispatcher_t_*,_false>._M_head_impl;
  (*pdVar1->_vptr_dispatcher_t[2])(pdVar1,this->m_env);
  this_00 = local_48;
  std::function<void_()>::function(&local_108,&local_40);
  run_timer_thread_and_go_further(this_00,&local_108);
  std::_Function_base::~_Function_base(&local_108.super__Function_base);
  run_default_dispatcher_and_go_further::anon_class_8_1_8991fb9c::operator()(local_150);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  std::__cxx11::string::~string(local_e8);
  return;
}

Assistant:

void
mt_env_infrastructure_t::run_default_dispatcher_and_go_further(
	env_init_t init_fn )
	{
		::so_5::impl::run_stage(
				"run_default_dispatcher",
				[this] {
					m_default_dispatcher->set_data_sources_name_base( "DEFAULT" );
					m_default_dispatcher->start( m_env );
				},
				[this] {
					m_default_dispatcher->shutdown();
					m_default_dispatcher->wait();
				},
				[this, init_fn] {
					run_timer_thread_and_go_further( std::move(init_fn) );
				} );
	}